

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_relationship * mg_relationship_copy_ca(mg_relationship *rel,mg_allocator *allocator)

{
  mg_relationship *allocator_00;
  mg_string *pmVar1;
  mg_map *pmVar2;
  mg_string *in_RSI;
  mg_allocator *in_RDI;
  mg_relationship *nrel;
  void *in_stack_ffffffffffffffd8;
  mg_allocator *in_stack_ffffffffffffffe0;
  mg_map *in_stack_fffffffffffffff8;
  
  if ((in_RDI != (mg_allocator *)0x0) &&
     (allocator_00 = (mg_relationship *)
                     mg_allocator_malloc(in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8
                                        ), allocator_00 != (mg_relationship *)0x0)) {
    allocator_00->id = (int64_t)in_RDI->malloc;
    allocator_00->start_id = (int64_t)in_RDI->realloc;
    allocator_00->end_id = (int64_t)in_RDI->free;
    pmVar1 = mg_string_copy_ca(in_RSI,(mg_allocator *)allocator_00);
    allocator_00->type = pmVar1;
    if (allocator_00->type != (mg_string *)0x0) {
      pmVar2 = mg_map_copy_ca(in_stack_fffffffffffffff8,in_RDI);
      allocator_00->properties = pmVar2;
      if (allocator_00->properties != (mg_map *)0x0) {
        return allocator_00;
      }
      mg_string_destroy((mg_string *)0x10ed38);
    }
    mg_allocator_free((mg_allocator *)allocator_00,in_stack_ffffffffffffffd8);
  }
  return (mg_relationship *)0x0;
}

Assistant:

mg_relationship *mg_relationship_copy_ca(const mg_relationship *rel,
                                         mg_allocator *allocator) {
  if (!rel) {
    return NULL;
  }
  mg_relationship *nrel =
      mg_allocator_malloc(&mg_system_allocator, sizeof(mg_relationship));
  if (!nrel) {
    return NULL;
  }
  nrel->id = rel->id;
  nrel->start_id = rel->start_id;
  nrel->end_id = rel->end_id;
  nrel->type = mg_string_copy_ca(rel->type, allocator);
  if (!nrel->type) {
    goto cleanup;
  }
  nrel->properties = mg_map_copy_ca(rel->properties, allocator);
  if (!nrel->properties) {
    goto cleanup_type;
  }
  return nrel;

cleanup_type:
  mg_string_destroy(nrel->type);

cleanup:
  mg_allocator_free(&mg_system_allocator, nrel);
  return NULL;
}